

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::HlslParseContext::declareArray
          (HlslParseContext *this,TSourceLoc *loc,TString *identifier,TType *type,TSymbol **symbol,
          bool track)

{
  TString *pTVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  TSymbol *pTVar5;
  TVariable *this_00;
  undefined4 extraout_var;
  char *pcVar6;
  undefined4 extraout_var_00;
  TType *existingType;
  bool currentScope;
  TSymbol **ppTStack_30;
  bool track_local;
  TSymbol **symbol_local;
  TType *type_local;
  TString *identifier_local;
  TSourceLoc *loc_local;
  HlslParseContext *this_local;
  
  existingType._7_1_ = track;
  ppTStack_30 = symbol;
  symbol_local = (TSymbol **)type;
  type_local = (TType *)identifier;
  identifier_local = (TString *)loc;
  loc_local = (TSourceLoc *)this;
  if (*symbol == (TSymbol *)0x0) {
    pTVar5 = TSymbolTable::find((this->super_TParseContextBase).symbolTable,identifier,(bool *)0x0,
                                (bool *)((long)&existingType + 6),(int *)0x0);
    *ppTStack_30 = pTVar5;
    if (((*ppTStack_30 != (TSymbol *)0x0) &&
        (identifier = (TString *)type_local, bVar2 = builtInName(this,(TString *)type_local), bVar2)
        ) && (bVar2 = TSymbolTable::atBuiltInLevel((this->super_TParseContextBase).symbolTable),
             !bVar2)) {
      return;
    }
    if ((*ppTStack_30 == (TSymbol *)0x0) || ((existingType._6_1_ & 1) == 0)) {
      this_00 = (TVariable *)TSymbol::operator_new((TSymbol *)0xf8,(size_t)identifier);
      TVariable::TVariable(this_00,(TString *)type_local,(TType *)symbol_local,false);
      *ppTStack_30 = (TSymbol *)this_00;
      TSymbolTable::insert((this->super_TParseContextBase).symbolTable,*ppTStack_30);
      if ((existingType._7_1_ & 1) == 0) {
        return;
      }
      bVar2 = TSymbolTable::atGlobalLevel((this->super_TParseContextBase).symbolTable);
      if (!bVar2) {
        return;
      }
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x4d])
                (this,*ppTStack_30);
      return;
    }
    iVar3 = (*(*ppTStack_30)->_vptr_TSymbol[0xb])();
    pTVar1 = identifier_local;
    if (CONCAT44(extraout_var,iVar3) != 0) {
      pcVar6 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                         ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                           *)type_local);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar1,"cannot redeclare a user-block member array",pcVar6,"");
      *ppTStack_30 = (TSymbol *)0x0;
      return;
    }
  }
  pTVar1 = identifier_local;
  if (*ppTStack_30 == (TSymbol *)0x0) {
    pcVar6 = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         *)type_local);
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,pTVar1,"array variable name expected",pcVar6,"");
  }
  else {
    iVar3 = (*(*ppTStack_30)->_vptr_TSymbol[0xd])();
    uVar4 = (*((TType *)CONCAT44(extraout_var_00,iVar3))->_vptr_TType[0x1e])();
    if ((uVar4 & 1) == 0) {
      TType::updateArraySizes((TType *)CONCAT44(extraout_var_00,iVar3),(TType *)symbol_local);
    }
  }
  return;
}

Assistant:

void HlslParseContext::declareArray(const TSourceLoc& loc, const TString& identifier, const TType& type,
                                    TSymbol*& symbol, bool track)
{
    if (symbol == nullptr) {
        bool currentScope;
        symbol = symbolTable.find(identifier, nullptr, &currentScope);

        if (symbol && builtInName(identifier) && ! symbolTable.atBuiltInLevel()) {
            // bad shader (errors already reported) trying to redeclare a built-in name as an array
            return;
        }
        if (symbol == nullptr || ! currentScope) {
            //
            // Successfully process a new definition.
            // (Redeclarations have to take place at the same scope; otherwise they are hiding declarations)
            //
            symbol = new TVariable(&identifier, type);
            symbolTable.insert(*symbol);
            if (track && symbolTable.atGlobalLevel())
                trackLinkage(*symbol);

            return;
        }
        if (symbol->getAsAnonMember()) {
            error(loc, "cannot redeclare a user-block member array", identifier.c_str(), "");
            symbol = nullptr;
            return;
        }
    }

    //
    // Process a redeclaration.
    //

    if (symbol == nullptr) {
        error(loc, "array variable name expected", identifier.c_str(), "");
        return;
    }

    // redeclareBuiltinVariable() should have already done the copyUp()
    TType& existingType = symbol->getWritableType();

    if (existingType.isSizedArray()) {
        // be more lenient for input arrays to geometry shaders and tessellation control outputs,
        // where the redeclaration is the same size
        return;
    }

    existingType.updateArraySizes(type);
}